

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

int cpu_ldsw_data_arm(CPUArchState_conflict *env,target_ulong_conflict ptr)

{
  int iVar1;
  
  iVar1 = cpu_ldsw_data_ra_arm(env,ptr,0);
  return iVar1;
}

Assistant:

int cpu_ldsw_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldsw_data_ra(env, ptr, 0);
}